

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O3

Entry * __thiscall
kj::Table<const_void_*,_kj::HashIndex<kj::_::HashSetCallbacks>_>::insert
          (Table<const_void_*,_kj::HashIndex<kj::_::HashSetCallbacks>_> *this,Entry *row)

{
  Entry *pEVar1;
  unsigned_long *puVar2;
  size_t newSize;
  Impl<0UL,_false> local_28 [16];
  
  Impl<0UL,_false>::insert
            (local_28,(Table<kj::HashMap<unsigned_long,_capnp::InterfaceSchema>::Entry,_kj::HashIndex<kj::HashMap<unsigned_long,_capnp::InterfaceSchema>::Callbacks>_>
                       *)this,*(long *)(this + 8) - *(long *)this >> 3,row,0xffffffff);
  if (local_28[0] != (Impl<0UL,_false>)0x1) {
    puVar2 = *(unsigned_long **)(this + 8);
    if (puVar2 == *(unsigned_long **)(this + 0x10)) {
      newSize = 4;
      if (puVar2 != *(unsigned_long **)this) {
        newSize = (long)puVar2 - (long)*(unsigned_long **)this >> 2;
      }
      Vector<const_void_*>::setCapacity((Vector<const_void_*> *)this,newSize);
      puVar2 = *(unsigned_long **)(this + 8);
    }
    *puVar2 = row->key;
    pEVar1 = *(Entry **)(this + 8);
    *(InterfaceSchema **)(this + 8) = &pEVar1->value;
    return pEVar1;
  }
  kj::_::throwDuplicateTableRow();
}

Assistant:

Row& Table<Row, Indexes...>::insert(Row&& row) {
  if (kj::none != Impl<>::insert(*this, rows.size(), row, kj::maxValue)) {
    _::throwDuplicateTableRow();
  } else {
    return rows.add(kj::mv(row));
  }
}